

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O1

size_t __thiscall SQASTWriter::writeSingleString(SQASTWriter *this,SQChar *s)

{
  OutputStream *pOVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  size_t sVar5;
  undefined4 extraout_var_00;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  
  iVar3 = (*this->stream->_vptr_OutputStream[3])();
  sVar5 = strlen(s);
  pOVar1 = this->stream;
  uVar6 = sVar5 & 0xffffffff;
  uVar8 = uVar6;
  if ((sVar5 & 0xffffff80) != 0) {
    do {
      (**pOVar1->_vptr_OutputStream)(pOVar1,(ulong)(byte)((byte)uVar6 | 0x80));
      uVar8 = uVar6 >> 7;
      bVar2 = 0x3fff < uVar6;
      uVar6 = uVar8;
    } while (bVar2);
  }
  (**pOVar1->_vptr_OutputStream)(pOVar1,uVar8 & 0xff);
  if (sVar5 != 0) {
    sVar7 = 0;
    do {
      (**this->stream->_vptr_OutputStream)(this->stream,(ulong)(byte)s[sVar7]);
      sVar7 = sVar7 + 1;
    } while (sVar5 != sVar7);
  }
  iVar4 = (*this->stream->_vptr_OutputStream[3])();
  return CONCAT44(extraout_var_00,iVar4) - CONCAT44(extraout_var,iVar3);
}

Assistant:

size_t SQASTWriter::writeSingleString(const SQChar *s) {
  size_t startOff = stream->pos();

  size_t stringLength = strlen(s);

  stream->writeUInt32(stringLength);

  for (size_t idx = 0; idx < stringLength; ++idx) {
    stream->writeInt8(s[idx]);
  }

  return stream->pos() - startOff;
}